

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

bool __thiscall
ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>::has_label_value
          (basic_dynamic_counter<double,_(unsigned_char)__x02_> *this,regex *regex)

{
  atomic<double> *paVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
  *e;
  pointer psVar4;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  map;
  anon_class_1_0_00000001 local_41;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  local_40;
  
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<137ul>>
  ::
  copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>,ylt::util::map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<137ul>>::copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>>()const::_lambda(auto:1&)_1_>
            (&local_40,
             &(this->super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>).map_,
             &local_41);
  for (psVar4 = local_40.
                super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar4 != local_40.
                super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->
             super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    paVar1 = &peVar2->value;
    pbVar3 = std::
             __find_if<std::__cxx11::string*,__gnu_cxx::__ops::_Iter_pred<ylt::metric::basic_dynamic_counter<double,(unsigned_char)2>::has_label_value(std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>const&)::_lambda(auto:1&)_1_>>
                       (peVar2,paVar1,regex);
    if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar1)
    break;
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::~vector(&local_40);
  return psVar4 != local_40.
                   super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool has_label_value(const std::regex &regex) override {
    auto map = Base::copy();
    for (auto &e : map) {
      auto &label_value = e->label;
      if (auto it = std::find_if(label_value.begin(), label_value.end(),
                                 [&](auto &val) {
                                   return std::regex_match(val, regex);
                                 });
          it != label_value.end()) {
        return true;
      }
    }

    return false;
  }